

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::walkStacklessTreeAgainstRay
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *raySource,
          cbtVector3 *rayTarget,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  cbtVector3 *v2;
  bool bVar4;
  bool bVar5;
  cbtOptimizedBvhNode *aabbMin2;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar21 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  cbtVector3 cVar25;
  cbtVector3 cVar26;
  cbtScalar param;
  cbtVector3 rayDirectionInverse;
  cbtVector3 rayDir;
  cbtScalar local_d4;
  cbtVector3 *local_d0;
  cbtVector3 local_c8;
  undefined8 local_b8;
  float fStack_b0;
  undefined4 uStack_ac;
  cbtVector3 local_a8;
  cbtNodeOverlapCallback *local_90;
  undefined8 local_88;
  uint local_80;
  undefined1 local_78 [16];
  cbtVector3 local_68;
  cbtVector3 local_50;
  cbtVector3 local_40;
  undefined1 auVar9 [16];
  
  local_68.m_floats._0_8_ = *(undefined8 *)raySource->m_floats;
  local_68.m_floats._8_8_ = *(undefined8 *)(raySource->m_floats + 2);
  aabbMin2 = (this->m_contiguousNodes).m_data;
  local_a8.m_floats._0_8_ = *(undefined8 *)raySource->m_floats;
  local_a8.m_floats._8_8_ = *(undefined8 *)(raySource->m_floats + 2);
  local_d0 = raySource;
  local_90 = nodeCallback;
  cbtVector3::setMin(&local_68,rayTarget);
  cbtVector3::setMax(&local_a8,rayTarget);
  v2 = local_d0;
  auVar10._0_4_ = (float)*(undefined8 *)aabbMin->m_floats + local_68.m_floats[0];
  auVar10._4_4_ = (float)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20) + local_68.m_floats[1];
  auVar10._8_8_ = 0;
  auVar21 = ZEXT856(0);
  local_68.m_floats._0_8_ = vmovlps_avx(auVar10);
  local_68.m_floats[2] = aabbMin->m_floats[2] + local_68.m_floats[2];
  auVar11._0_4_ = (float)*(undefined8 *)aabbMax->m_floats + local_a8.m_floats[0];
  auVar11._4_4_ = (float)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20) + local_a8.m_floats[1];
  auVar11._8_8_ = 0;
  local_a8.m_floats._0_8_ = vmovlps_avx(auVar11);
  auVar16 = (undefined1  [56])0x0;
  local_a8.m_floats[2] = aabbMax->m_floats[2] + local_a8.m_floats[2];
  cVar25 = ::operator-(rayTarget,local_d0);
  auVar19._0_8_ = cVar25.m_floats._8_8_;
  auVar19._8_56_ = auVar21;
  auVar14._0_8_ = cVar25.m_floats._0_8_;
  auVar14._8_56_ = auVar16;
  local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar14._0_16_,auVar19._0_16_);
  auVar16 = ZEXT856(local_40.m_floats._8_8_);
  cbtVector3::normalize(&local_40);
  cVar26 = ::operator-(rayTarget,v2);
  cVar25.m_floats = local_40.m_floats;
  auVar20._0_8_ = cVar26.m_floats._8_8_;
  auVar20._8_56_ = auVar21;
  auVar15._0_8_ = cVar26.m_floats._0_8_;
  auVar15._8_56_ = auVar16;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = local_40.m_floats[0];
  auVar22._4_4_ = local_40.m_floats[1];
  local_40.m_floats[2] = cVar25.m_floats[2];
  auVar23._0_4_ = cVar25.m_floats[0] * cVar26.m_floats[0];
  auVar23._4_4_ = cVar25.m_floats[1] * cVar26.m_floats[1];
  auVar23._8_4_ = auVar16._0_4_ * 0.0;
  auVar23._12_4_ = auVar16._4_4_ * 0.0;
  uVar1 = vcmpps_avx512vl(auVar22,ZEXT816(0) << 0x40,0);
  auVar10 = vmovshdup_avx(auVar23);
  auVar24._8_4_ = 0x3f800000;
  auVar24._0_8_ = 0x3f8000003f800000;
  auVar24._12_4_ = 0x3f800000;
  auVar10 = vfmadd231ss_fma(auVar10,auVar22,auVar15._0_16_);
  local_78 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_40.m_floats[2]),auVar20._0_16_);
  auVar10 = vdivps_avx(auVar24,auVar22);
  auVar8 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
  bVar4 = (bool)((byte)uVar1 & 1);
  auVar9._0_4_ = (uint)bVar4 * auVar8._0_4_ | (uint)!bVar4 * auVar10._0_4_;
  bVar4 = (bool)((byte)(uVar1 >> 1) & 1);
  auVar9._4_4_ = (uint)bVar4 * auVar8._4_4_ | (uint)!bVar4 * auVar10._4_4_;
  bVar4 = (bool)((byte)(uVar1 >> 2) & 1);
  auVar9._8_4_ = (uint)bVar4 * auVar8._8_4_ | (uint)!bVar4 * auVar10._8_4_;
  bVar4 = (bool)((byte)(uVar1 >> 3) & 1);
  auVar9._12_4_ = (uint)bVar4 * auVar8._12_4_ | (uint)!bVar4 * auVar10._12_4_;
  uVar2 = vcmpss_avx512f(ZEXT416((uint)local_40.m_floats[2]),ZEXT816(0) << 0x40,0);
  bVar4 = (bool)((byte)uVar2 & 1);
  local_50.m_floats[2] =
       (cbtScalar)((uint)bVar4 * 0x5d5e0b6b + (uint)!bVar4 * (int)(1.0 / local_40.m_floats[2]));
  local_50.m_floats._0_8_ = vmovlps_avx(auVar9);
  auVar10 = vcmpps_avx(auVar9,ZEXT816(0) << 0x40,1);
  auVar8._8_4_ = 1;
  auVar8._0_8_ = 0x100000001;
  auVar8._12_4_ = 1;
  auVar10 = vandps_avx512vl(auVar10,auVar8);
  iVar7 = 0;
  iVar6 = 0;
  local_88 = vmovlps_avx(auVar10);
  local_80 = (uint)(local_50.m_floats[2] < 0.0);
  local_40.m_floats = cVar25.m_floats;
  do {
    if (this->m_curNodeIndex <= iVar7) {
      if (maxIterations < iVar6) {
        maxIterations = iVar6;
      }
      return;
    }
    local_d4 = 1.0;
    uVar2 = *(undefined8 *)((aabbMin2->m_aabbMinOrg).m_floats + 2);
    uVar3 = *(undefined8 *)((aabbMin2->m_aabbMaxOrg).m_floats + 2);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)aabbMax->m_floats;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)(aabbMin2->m_aabbMinOrg).m_floats;
    auVar10 = vsubps_avx(auVar17,auVar12);
    local_c8.m_floats._0_8_ = vmovlps_avx(auVar10);
    local_c8.m_floats[2] = (cbtScalar)uVar2;
    local_c8.m_floats[3] = (cbtScalar)((ulong)uVar2 >> 0x20);
    local_c8.m_floats[2] = local_c8.m_floats[2] - aabbMax->m_floats[2];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)aabbMin->m_floats;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(aabbMin2->m_aabbMaxOrg).m_floats;
    auVar10 = vsubps_avx(auVar18,auVar13);
    local_b8 = vmovlps_avx(auVar10);
    fStack_b0 = (float)uVar3;
    _fStack_b0 = CONCAT44((int)((ulong)uVar3 >> 0x20),fStack_b0 - aabbMin->m_floats[2]);
    bVar4 = TestAabbAgainstAabb2
                      (&local_68,&local_a8,&aabbMin2->m_aabbMinOrg,&aabbMin2->m_aabbMaxOrg);
    if (bVar4) {
      bVar5 = cbtRayAabb2(local_d0,&local_50,(uint *)&local_88,&local_c8,&local_d4,0.0,
                          (cbtScalar)local_78._0_4_);
      bVar4 = aabbMin2->m_escapeIndex == -1;
      if ((!bVar5) || (aabbMin2->m_escapeIndex != -1)) goto LAB_00dddcd8;
      (*local_90->_vptr_cbtNodeOverlapCallback[2])
                (local_90,(ulong)(uint)aabbMin2->m_subPart,(ulong)(uint)aabbMin2->m_triangleIndex);
LAB_00dddcf0:
      aabbMin2 = aabbMin2 + 1;
      iVar7 = iVar7 + 1;
    }
    else {
      bVar4 = aabbMin2->m_escapeIndex == -1;
      bVar5 = false;
LAB_00dddcd8:
      if ((bVar4) || (bVar5 != false)) goto LAB_00dddcf0;
      iVar7 = iVar7 + aabbMin2->m_escapeIndex;
      aabbMin2 = aabbMin2 + aabbMin2->m_escapeIndex;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void cbtQuantizedBvh::walkStacklessTreeAgainstRay(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& raySource, const cbtVector3& rayTarget, const cbtVector3& aabbMin, const cbtVector3& aabbMax, int startNodeIndex, int endNodeIndex) const
{
	cbtAssert(!m_useQuantization);

	const cbtOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap = 0;
	unsigned rayBoxOverlap = 0;
	cbtScalar lambda_max = 1.0;

	/* Quick pruning by quantized box */
	cbtVector3 rayAabbMin = raySource;
	cbtVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

#ifdef RAYAABB2
	cbtVector3 rayDir = (rayTarget - raySource);
	rayDir.normalize();
	lambda_max = rayDir.dot(rayTarget - raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	cbtVector3 rayDirectionInverse;
	rayDirectionInverse[0] = rayDir[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[0];
	rayDirectionInverse[1] = rayDir[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[1];
	rayDirectionInverse[2] = rayDir[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[2];
	unsigned int sign[3] = {rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};
#endif

	cbtVector3 bounds[2];

	while (curIndex < m_curNodeIndex)
	{
		cbtScalar param = 1.0;
		//catch bugs in tree data
		cbtAssert(walkIterations < m_curNodeIndex);

		walkIterations++;

		bounds[0] = rootNode->m_aabbMinOrg;
		bounds[1] = rootNode->m_aabbMaxOrg;
		/* Add box cast extents */
		bounds[0] -= aabbMax;
		bounds[1] -= aabbMin;

		aabbOverlap = TestAabbAgainstAabb2(rayAabbMin, rayAabbMax, rootNode->m_aabbMinOrg, rootNode->m_aabbMaxOrg);
		//perhaps profile if it is worth doing the aabbOverlap test first

#ifdef RAYAABB2
		///careful with this check: need to check division by zero (above) and fix the unQuantize method
		///thanks Joerg/hiker for the reproduction case!
		///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858
		rayBoxOverlap = aabbOverlap ? cbtRayAabb2(raySource, rayDirectionInverse, sign, bounds, param, 0.0f, lambda_max) : false;

#else
		cbtVector3 normal;
		rayBoxOverlap = cbtRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif

		isLeafNode = rootNode->m_escapeIndex == -1;

		//PCK: unsigned instead of bool
		if (isLeafNode && (rayBoxOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart, rootNode->m_triangleIndex);
		}

		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}